

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

void __thiscall
StackArgWithFormalsTracker::SetFormalsArraySyms(StackArgWithFormalsTracker *this,SymID symId)

{
  JitArenaAllocator *pJVar1;
  BVSparse<Memory::JitArenaAllocator> *pBVar2;
  
  if (this->formalsArraySyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pBVar2 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3f1274);
    pJVar1 = this->alloc;
    pBVar2->head = (Type_conflict)0x0;
    pBVar2->lastFoundIndex = (Type_conflict)0x0;
    pBVar2->alloc = pJVar1;
    pBVar2->lastUsedNodePrevNextField = (Type)pBVar2;
    this->formalsArraySyms = pBVar2;
  }
  BVSparse<Memory::JitArenaAllocator>::Set(this->formalsArraySyms,symId);
  return;
}

Assistant:

void
StackArgWithFormalsTracker::SetFormalsArraySyms(SymID symId)
{
    if (formalsArraySyms == nullptr)
    {
        formalsArraySyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    }
    formalsArraySyms->Set(symId);
}